

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-Z.cpp
# Opt level: O3

bool __thiscall
baryonyx::itm::
solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>
::local_affect<baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*>
          (solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>
           *this,bit_array *x,row_value *it,int k,int selected,int r_size,float kappa,float delta)

{
  float *args_3;
  float *pfVar1;
  float *args_3_00;
  float fVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  float fVar10;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  uint local_5c;
  int local_58;
  int local_54;
  long local_50;
  undefined1 local_48 [16];
  
  local_50 = (long)k;
  args_3 = (float *)(*(long *)(this + 0x78) + local_50 * 4);
  fVar10 = *args_3;
  local_48 = ZEXT416((uint)fVar10);
  fVar2 = kappa / (1.0 - kappa) + delta;
  local_5c = r_size;
  local_58 = selected;
  local_54 = k;
  if (selected < 0) {
    pfVar1 = *(float **)(this + 0x60);
    *args_3 = fVar10 + *pfVar1 * 0.5;
    fmt_00._M_str = "    selected: {}/{} ({})/2 = pi {}\n";
    fmt_00._M_len = 0x23;
    debug_logger<true>::log<int,int,float,float>
              ((debug_logger<true> *)this,fmt_00,&local_58,(int *)&local_5c,pfVar1,args_3);
    if (local_5c != 0) {
      lVar7 = 4;
      uVar8 = 0;
      do {
        iVar5 = *(int *)(*(long *)(this + 0x60) + lVar7);
        bit_array_impl::unset(&x->super_bit_array_impl,it[iVar5].column);
        *(float *)(*(long *)(this + 0x50) + (long)it[iVar5].value * 4) =
             *(float *)(*(long *)(this + 0x50) + (long)it[iVar5].value * 4) - fVar2;
        fVar10 = solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
                 ::local_compute_reduced_cost<baryonyx::bit_array>
                           ((solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
                             *)this,it[iVar5].column,x);
        if (fVar10 <= 0.0) {
          *(float *)(*(long *)(this + 0x50) + (long)it[iVar5].value * 4) =
               (fVar10 + *(float *)(*(long *)(this + 0x50) + (long)it[iVar5].value * 4)) - fVar2;
        }
        uVar8 = uVar8 + 1;
        lVar7 = lVar7 + 0xc;
      } while (uVar8 != local_5c);
    }
  }
  else {
    pfVar1 = (float *)(*(long *)(this + 0x60) + (ulong)(uint)selected * 0xc);
    if ((int)(selected + 1U) < r_size) {
      args_3_00 = (float *)(*(long *)(this + 0x60) + (ulong)(selected + 1U) * 0xc);
      *args_3 = fVar10 + (*pfVar1 + *args_3_00) * 0.5;
      fmt._M_str = "    selected: {}/{} ({}x{})/2 = pi {}\n";
      fmt._M_len = 0x26;
      debug_logger<true>::log<int,int,float,float,float>
                ((debug_logger<true> *)this,fmt,&local_58,(int *)&local_5c,pfVar1,args_3_00,args_3);
      if (local_58 < 0) {
        uVar6 = 0;
      }
      else {
        lVar7 = -1;
        lVar9 = 4;
        do {
          iVar5 = *(int *)(*(long *)(this + 0x60) + lVar9);
          bit_array_impl::set(&x->super_bit_array_impl,it[iVar5].column);
          *(float *)(*(long *)(this + 0x50) + (long)it[iVar5].value * 4) =
               fVar2 + *(float *)(*(long *)(this + 0x50) + (long)it[iVar5].value * 4);
          fVar10 = solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
                   ::local_compute_reduced_cost<baryonyx::bit_array>
                             ((solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
                               *)this,it[iVar5].column,x);
          if (0.0 <= fVar10) {
            *(float *)(*(long *)(this + 0x50) + (long)it[iVar5].value * 4) =
                 (*(float *)(*(long *)(this + 0x50) + (long)it[iVar5].value * 4) - fVar10) + fVar2;
          }
          lVar7 = lVar7 + 1;
          lVar9 = lVar9 + 0xc;
        } while (lVar7 < local_58);
        uVar6 = (int)lVar7 + 1;
      }
      if (uVar6 != local_5c) {
        uVar8 = (ulong)uVar6;
        lVar7 = uVar8 * 0xc + 4;
        do {
          iVar5 = *(int *)(*(long *)(this + 0x60) + lVar7);
          bit_array_impl::unset(&x->super_bit_array_impl,it[iVar5].column);
          *(float *)(*(long *)(this + 0x50) + (long)it[iVar5].value * 4) =
               *(float *)(*(long *)(this + 0x50) + (long)it[iVar5].value * 4) - fVar2;
          fVar10 = solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
                   ::local_compute_reduced_cost<baryonyx::bit_array>
                             ((solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
                               *)this,it[iVar5].column,x);
          if (fVar10 <= 0.0) {
            *(float *)(*(long *)(this + 0x50) + (long)it[iVar5].value * 4) =
                 (fVar10 + *(float *)(*(long *)(this + 0x50) + (long)it[iVar5].value * 4)) - fVar2;
          }
          uVar8 = uVar8 + 1;
          lVar7 = lVar7 + 0xc;
        } while (uVar8 != local_5c);
      }
    }
    else {
      auVar3 = vfmadd132ss_fma(ZEXT416((uint)*pfVar1),local_48,ZEXT416(0x3fc00000));
      *args_3 = auVar3._0_4_;
      fmt_01._M_str = "    selected: {}/{} ({})/2 = pi {}\n";
      fmt_01._M_len = 0x23;
      debug_logger<true>::log<int,int,float,float>
                ((debug_logger<true> *)this,fmt_01,&local_58,(int *)&local_5c,pfVar1,args_3);
      if (local_5c != 0) {
        lVar7 = 4;
        uVar8 = 0;
        do {
          iVar5 = *(int *)(*(long *)(this + 0x60) + lVar7);
          bit_array_impl::set(&x->super_bit_array_impl,it[iVar5].column);
          *(float *)(*(long *)(this + 0x50) + (long)it[iVar5].value * 4) =
               fVar2 + *(float *)(*(long *)(this + 0x50) + (long)it[iVar5].value * 4);
          fVar10 = solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
                   ::local_compute_reduced_cost<baryonyx::bit_array>
                             ((solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
                               *)this,it[iVar5].column,x);
          if (0.0 <= fVar10) {
            *(float *)(*(long *)(this + 0x50) + (long)it[iVar5].value * 4) =
                 (*(float *)(*(long *)(this + 0x50) + (long)it[iVar5].value * 4) - fVar10) + fVar2;
          }
          uVar8 = uVar8 + 1;
          lVar7 = lVar7 + 0xc;
        } while (uVar8 != local_5c);
      }
    }
  }
  bVar4 = is_valid_constraint<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>,baryonyx::bit_array>
                    ((solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
                      *)this,local_54,x);
  if (!bVar4) {
    local_affect<baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*>();
  }
  iVar5 = vmovmskps_avx(local_48);
  return (bool)((byte)((byte)((uint)(iVar5 << 0x1f) >> 0x18) ^
                      (byte)((uint)*(undefined4 *)(*(long *)(this + 0x78) + local_50 * 4) >> 0x18))
               >> 7);
}

Assistant:

bool local_affect(Xtype& x,
                      Iterator it,
                      int k,
                      int selected,
                      int r_size,
                      const Float kappa,
                      const Float delta)
    {
        constexpr Float one{ 1 };
        constexpr Float two{ 2 };
        constexpr Float middle{ (two + one) / two };

        const auto old_pi = pi[k];

        auto d = (kappa / (one - kappa)) + delta;

        if (selected < 0) {
            pi[k] += R[0].value / two;

            logger::log("    selected: {}/{} ({})/2 = pi {}\n",
                        selected,
                        r_size,
                        R[0].value,
                        pi[k]);

            for (int i = 0; i != r_size; ++i) {
                auto var = it + R[i].id;

                x.unset(var->column);
                P[var->value] -= d;

                auto repair = local_compute_reduced_cost(var->column, x);
                if (repair <= 0)
                    P[var->value] = P[var->value] + repair - d;
            }
        } else if (selected + 1 >= r_size) {
            pi[k] += R[selected].value * middle;

            logger::log("    selected: {}/{} ({})/2 = pi {}\n",
                        selected,
                        r_size,
                        R[selected].value,
                        pi[k]);

            for (int i = 0; i != r_size; ++i) {
                auto var = it + R[i].id;

                x.set(var->column);
                P[var->value] += d;

                auto repair = local_compute_reduced_cost(var->column, x);
                if (repair >= 0)
                    P[var->value] = P[var->value] - repair + d;
            }
        } else {
            pi[k] += ((R[selected].value + R[selected + 1].value) / two);

            logger::log("    selected: {}/{} ({}x{})/2 = pi {}\n",
                        selected,
                        r_size,
                        R[selected].value,
                        R[selected + 1].value,
                        pi[k]);

            int i = 0;
            for (; i <= selected; ++i) {
                auto var = it + R[i].id;

                x.set(var->column);
                P[var->value] += d;

                auto repair = local_compute_reduced_cost(var->column, x);
                if (repair >= 0)
                    P[var->value] = P[var->value] - repair + d;
            }

            for (; i != r_size; ++i) {
                auto var = it + R[i].id;

                x.unset(var->column);
                P[var->value] -= d;

                auto repair = local_compute_reduced_cost(var->column, x);
                if (repair <= 0)
                    P[var->value] = P[var->value] + repair - d;
            }
        }

        // TODO job: develops is_valid_constraint for all the solvers
        bx_expects(is_valid_constraint(*this, k, x));

        return is_signbit_change(old_pi, pi[k]);
    }